

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenTable(CppGenerator *this,StructDef *struct_def)

{
  Namespace *ns;
  StructDef *struct_def_00;
  bool bVar1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *pvVar2;
  ulong uVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar4;
  reference ppEVar5;
  allocator<char> local_b51;
  string local_b50;
  string local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  string local_a50;
  string local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  allocator<char> local_939;
  string local_938;
  string local_918;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  undefined1 local_8b0 [8];
  string full_struct_name;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_880;
  const_iterator u_it;
  allocator<char> local_851;
  string local_850;
  EnumDef *local_830;
  EnumDef *u;
  FieldDef **field_3;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2_2;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  string local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  string local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  reference local_648;
  FieldDef **field_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2_1;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  undefined1 local_420 [8];
  string nfn;
  allocator<char> local_3d9;
  string local_3d8;
  reference local_3b8;
  FieldDef **field_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  reference local_240;
  FieldDef **field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    GenNativeTable(this,struct_def);
  }
  GenComment(this,&(local_18->super_Definition).doc_comment,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"STRUCT_NAME",&local_39);
  Name_abi_cxx11_(&local_70,this,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "struct {{STRUCT_NAME}} FLATBUFFERS_FINAL_CLASS : private ::flatbuffers::Table {",
             &local_91);
  CodeWriter::operator+=(&this->code_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"  typedef {{NATIVE_NAME}} NativeTableType;",&local_b9);
    CodeWriter::operator+=(&this->code_,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"  typedef {{STRUCT_NAME}}Builder Builder;",&local_e1);
  CodeWriter::operator+=(&this->code_,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  GenBinarySchemaTypeDef(this,((this->super_BaseGenerator).parser_)->root_struct_def_);
  if (1 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"  struct Traits;",&local_109);
    CodeWriter::operator+=(&this->code_,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "  static const ::flatbuffers::TypeTable *MiniReflectTypeTable() {",&local_131);
    CodeWriter::operator+=(&this->code_,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"    return {{STRUCT_NAME}}TypeTable();",&local_159);
    CodeWriter::operator+=(&this->code_,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"  }",&local_181);
    CodeWriter::operator+=(&this->code_,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  struct_def_00 = local_18;
  Name_abi_cxx11_(&local_1a8,this,&local_18->super_Definition);
  GenFullyQualifiedNameGetter(this,struct_def_00,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(local_18->fields).vec);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"SEP",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
    CodeWriter::SetValue(&this->code_,&local_1c8,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,
               "  enum FlatBuffersVTableOffset FLATBUFFERS_VTABLE_UNDERLYING_TYPE {",
               (allocator<char> *)((long)&__range3 + 7));
    CodeWriter::operator+=(&this->code_,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    pvVar2 = &(local_18->fields).vec;
    __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (pvVar2);
    field = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field), bVar1) {
      local_240 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&__end3);
      if (((*local_240)->deprecated & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"OFFSET_NAME",&local_261);
        GenFieldOffsetName_abi_cxx11_(&local_288,this,*local_240);
        CodeWriter::SetValue(&this->code_,&local_260,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"OFFSET_VALUE",&local_2a9);
        NumToString<unsigned_short>(&local_2d0,((*local_240)->value).offset);
        CodeWriter::SetValue(&this->code_,&local_2a8,&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator(&local_2a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"{{SEP}}    {{OFFSET_NAME}} = {{OFFSET_VALUE}}\\",&local_2f1
                  );
        CodeWriter::operator+=(&this->code_,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::allocator<char>::~allocator(&local_2f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"SEP",&local_319);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,",\n",&local_341);
        CodeWriter::SetValue(&this->code_,&local_318,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator(&local_341);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator(&local_319);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"",&local_369);
    CodeWriter::operator+=(&this->code_,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"  };",(allocator<char> *)((long)&__range2 + 7));
    CodeWriter::operator+=(&this->code_,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  }
  pvVar2 = &(local_18->fields).vec;
  __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (pvVar2);
  field_1 = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                     *)&field_1), bVar1) {
    local_3b8 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&__end2);
    if (((*local_3b8)->deprecated & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"FIELD_NAME",&local_3d9);
      Name_abi_cxx11_((string *)((long)&nfn.field_2 + 8),this,*local_3b8);
      CodeWriter::SetValue(&this->code_,&local_3d8,(string *)((long)&nfn.field_2 + 8));
      std::__cxx11::string::~string((string *)(nfn.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      GenTableFieldGetter(this,*local_3b8);
      if (((this->opts_).super_IDLOptions.mutable_buffer & 1U) != 0) {
        GenTableFieldSetter(this,*local_3b8);
      }
      GetNestedFlatBufferName_abi_cxx11_((string *)local_420,this,*local_3b8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"CPP_NAME",&local_441);
        CodeWriter::SetValue(&this->code_,&local_440,(string *)local_420);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator(&local_441);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"  const {{CPP_NAME}} *{{FIELD_NAME}}_nested_root() const {"
                   ,&local_469);
        CodeWriter::operator+=(&this->code_,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator(&local_469);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_490,"    const auto _f = {{FIELD_NAME}}();",&local_491);
        CodeWriter::operator+=(&this->code_,&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator(&local_491);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b8,
                   "    return _f ? ::flatbuffers::GetRoot<{{CPP_NAME}}>(_f->Data())",&local_4b9);
        CodeWriter::operator+=(&this->code_,&local_4b8);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::allocator<char>::~allocator(&local_4b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4e0,"              : nullptr;",&local_4e1);
        CodeWriter::operator+=(&this->code_,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::allocator<char>::~allocator(&local_4e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"  }",&local_509);
        CodeWriter::operator+=(&this->code_,&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        std::allocator<char>::~allocator(&local_509);
      }
      if (((*local_3b8)->flexbuffer & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,
                   "  flexbuffers::Reference {{FIELD_NAME}}_flexbuffer_root() const {",&local_531);
        CodeWriter::operator+=(&this->code_,&local_530);
        std::__cxx11::string::~string((string *)&local_530);
        std::allocator<char>::~allocator(&local_531);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_558,"    const auto _f = {{FIELD_NAME}}();",&local_559);
        CodeWriter::operator+=(&this->code_,&local_558);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator(&local_559);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_580,
                   "    return _f ? flexbuffers::GetRoot(_f->Data(), _f->size())",&local_581);
        CodeWriter::operator+=(&this->code_,&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        std::allocator<char>::~allocator(&local_581);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a8,"              : flexbuffers::Reference();",&local_5a9);
        CodeWriter::operator+=(&this->code_,&local_5a8);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"  }",&local_5d1);
        CodeWriter::operator+=(&this->code_,&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::allocator<char>::~allocator(&local_5d1);
      }
      if (((*local_3b8)->key & 1U) != 0) {
        GenKeyFieldMethods(this,*local_3b8);
      }
      std::__cxx11::string::~string((string *)local_420);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2);
  }
  if (((this->opts_).super_IDLOptions.cpp_static_reflection & 1U) != 0) {
    GenIndexBasedFieldGetter(this,local_18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"  bool Verify(::flatbuffers::Verifier &verifier) const {",
             &local_5f9);
  CodeWriter::operator+=(&this->code_,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"    return VerifyTableStart(verifier)\\",
             (allocator<char> *)((long)&__range2_1 + 7));
  CodeWriter::operator+=(&this->code_,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
  pvVar2 = &(local_18->fields).vec;
  __end2_1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (pvVar2);
  field_2 = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                             *)&field_2), bVar1) {
    local_648 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&__end2_1);
    if (((*local_648)->deprecated & 1U) == 0) {
      GenVerifyCall(this,*local_648," &&\n           ");
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668," &&\n           verifier.EndTable();",&local_669);
  CodeWriter::operator+=(&this->code_,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"  }",&local_691);
  CodeWriter::operator+=(&this->code_,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    TableUnPackSignature_abi_cxx11_(&local_6f8,this,local_18,true,&(this->opts_).super_IDLOptions);
    std::operator+(&local_6d8,"  ",&local_6f8);
    std::operator+(&local_6b8,&local_6d8,";");
    CodeWriter::operator+=(&this->code_,&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    TableUnPackToSignature_abi_cxx11_(&local_758,this,local_18,true,&(this->opts_).super_IDLOptions)
    ;
    std::operator+(&local_738,"  ",&local_758);
    std::operator+(&local_718,&local_738,";");
    CodeWriter::operator+=(&this->code_,&local_718);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_758);
    TablePackSignature_abi_cxx11_(&local_7b8,this,local_18,true,&(this->opts_).super_IDLOptions);
    std::operator+(&local_798,"  ",&local_7b8);
    std::operator+(&local_778,&local_798,";");
    CodeWriter::operator+=(&this->code_,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_798);
    std::__cxx11::string::~string((string *)&local_7b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"};",&local_7d9);
  CodeWriter::operator+=(&this->code_,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"",(allocator<char> *)((long)&__range2_2 + 7));
  CodeWriter::operator+=(&this->code_,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_2 + 7));
  pvVar2 = &(local_18->fields).vec;
  __end2_2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (pvVar2);
  field_3 = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                             *)&field_3), bVar1) {
    u = (EnumDef *)
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator*(&__end2_2);
    if (((((*(FieldDef **)&(u->super_Definition).name)->deprecated & 1U) == 0) &&
        (((*(FieldDef **)&(u->super_Definition).name)->value).type.base_type == BASE_TYPE_UNION)) &&
       (local_830 = ((*(FieldDef **)&(u->super_Definition).name)->value).type.enum_def,
       (local_830->uses_multiple_type_instances & 1U) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,"FIELD_NAME",&local_851);
      Name_abi_cxx11_((string *)&u_it,this,*(FieldDef **)&(u->super_Definition).name);
      CodeWriter::SetValue(&this->code_,&local_850,(string *)&u_it);
      std::__cxx11::string::~string((string *)&u_it);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      pvVar4 = EnumDef::Vals(local_830);
      local_880._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar4);
      while( true ) {
        pvVar4 = EnumDef::Vals(local_830);
        ev = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar4);
        bVar1 = __gnu_cxx::operator!=
                          (&local_880,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev);
        if (!bVar1) break;
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_880);
        full_struct_name.field_2._8_8_ = *ppEVar5;
        if ((((EnumVal *)full_struct_name.field_2._8_8_)->union_type).base_type != BASE_TYPE_NONE) {
          GetUnionElement_abi_cxx11_
                    ((string *)local_8b0,this,(EnumVal *)full_struct_name.field_2._8_8_,false,
                     &(this->opts_).super_IDLOptions);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8d0,"U_ELEMENT_TYPE",&local_8d1);
          ns = (local_830->super_Definition).defined_namespace;
          GetEnumValUse_abi_cxx11_
                    (&local_918,this,local_830,(EnumVal *)full_struct_name.field_2._8_8_);
          BaseGenerator::WrapInNameSpace(&local_8f8,&this->super_BaseGenerator,ns,&local_918);
          CodeWriter::SetValue(&this->code_,&local_8d0,&local_8f8);
          std::__cxx11::string::~string((string *)&local_8f8);
          std::__cxx11::string::~string((string *)&local_918);
          std::__cxx11::string::~string((string *)&local_8d0);
          std::allocator<char>::~allocator(&local_8d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_938,"U_FIELD_TYPE",&local_939);
          std::operator+(&local_980,"const ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8b0);
          std::operator+(&local_960,&local_980," *");
          CodeWriter::SetValue(&this->code_,&local_938,&local_960);
          std::__cxx11::string::~string((string *)&local_960);
          std::__cxx11::string::~string((string *)&local_980);
          std::__cxx11::string::~string((string *)&local_938);
          std::allocator<char>::~allocator(&local_939);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9a0,"U_ELEMENT_NAME",&local_9a1);
          CodeWriter::SetValue(&this->code_,&local_9a0,(string *)local_8b0);
          std::__cxx11::string::~string((string *)&local_9a0);
          std::allocator<char>::~allocator(&local_9a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9c8,"U_FIELD_NAME",&local_9c9);
          Name_abi_cxx11_(&local_a30,this,*(FieldDef **)&(u->super_Definition).name);
          std::operator+(&local_a10,&local_a30,"_as_");
          Name_abi_cxx11_(&local_a50,this,(EnumVal *)full_struct_name.field_2._8_8_);
          std::operator+(&local_9f0,&local_a10,&local_a50);
          CodeWriter::SetValue(&this->code_,&local_9c8,&local_9f0);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::__cxx11::string::~string((string *)&local_a50);
          std::__cxx11::string::~string((string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_a30);
          std::__cxx11::string::~string((string *)&local_9c8);
          std::allocator<char>::~allocator(&local_9c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a70,
                     "template<> inline {{U_FIELD_TYPE}}{{STRUCT_NAME}}::{{FIELD_NAME}}_as<{{U_ELEMENT_NAME}}>() const {"
                     ,&local_a71);
          CodeWriter::operator+=(&this->code_,&local_a70);
          std::__cxx11::string::~string((string *)&local_a70);
          std::allocator<char>::~allocator(&local_a71);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a98,"  return {{U_FIELD_NAME}}();",&local_a99);
          CodeWriter::operator+=(&this->code_,&local_a98);
          std::__cxx11::string::~string((string *)&local_a98);
          std::allocator<char>::~allocator(&local_a99);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"}",&local_ac1);
          CodeWriter::operator+=(&this->code_,&local_ac0);
          std::__cxx11::string::~string((string *)&local_ac0);
          std::allocator<char>::~allocator(&local_ac1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"",&local_ae9);
          CodeWriter::operator+=(&this->code_,&local_ae8);
          std::__cxx11::string::~string((string *)&local_ae8);
          std::allocator<char>::~allocator(&local_ae9);
          std::__cxx11::string::~string((string *)local_8b0);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_880);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2_2);
  }
  GenBuilders(this,local_18);
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    TableCreateSignature_abi_cxx11_(&local_b30,this,local_18,true,&(this->opts_).super_IDLOptions);
    std::operator+(&local_b10,&local_b30,";");
    CodeWriter::operator+=(&this->code_,&local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::~string((string *)&local_b30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,"",&local_b51);
    CodeWriter::operator+=(&this->code_,&local_b50);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator(&local_b51);
  }
  return;
}

Assistant:

void GenTable(const StructDef &struct_def) {
    if (opts_.generate_object_based_api) { GenNativeTable(struct_def); }

    // Generate an accessor struct, with methods of the form:
    // type name() const { return GetField<type>(offset, defaultval); }
    GenComment(struct_def.doc_comment);

    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_ +=
        "struct {{STRUCT_NAME}} FLATBUFFERS_FINAL_CLASS"
        " : private ::flatbuffers::Table {";
    if (opts_.generate_object_based_api) {
      code_ += "  typedef {{NATIVE_NAME}} NativeTableType;";
    }
    code_ += "  typedef {{STRUCT_NAME}}Builder Builder;";
    GenBinarySchemaTypeDef(parser_.root_struct_def_);

    if (opts_.g_cpp_std >= cpp::CPP_STD_17) { code_ += "  struct Traits;"; }
    if (opts_.mini_reflect != IDLOptions::kNone) {
      code_ +=
          "  static const ::flatbuffers::TypeTable *MiniReflectTypeTable() {";
      code_ += "    return {{STRUCT_NAME}}TypeTable();";
      code_ += "  }";
    }

    GenFullyQualifiedNameGetter(struct_def, Name(struct_def));

    // Generate field id constants.
    if (!struct_def.fields.vec.empty()) {
      // We need to add a trailing comma to all elements except the last one as
      // older versions of gcc complain about this.
      code_.SetValue("SEP", "");
      code_ +=
          "  enum FlatBuffersVTableOffset FLATBUFFERS_VTABLE_UNDERLYING_TYPE {";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) {
          // Deprecated fields won't be accessible.
          continue;
        }

        code_.SetValue("OFFSET_NAME", GenFieldOffsetName(*field));
        code_.SetValue("OFFSET_VALUE", NumToString(field->value.offset));
        code_ += "{{SEP}}    {{OFFSET_NAME}} = {{OFFSET_VALUE}}\\";
        code_.SetValue("SEP", ",\n");
      }
      code_ += "";
      code_ += "  };";
    }

    // Generate the accessors.
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }

      code_.SetValue("FIELD_NAME", Name(*field));
      GenTableFieldGetter(*field);
      if (opts_.mutable_buffer) { GenTableFieldSetter(*field); }

      auto nfn = GetNestedFlatBufferName(*field);
      if (!nfn.empty()) {
        code_.SetValue("CPP_NAME", nfn);
        code_ += "  const {{CPP_NAME}} *{{FIELD_NAME}}_nested_root() const {";
        code_ += "    const auto _f = {{FIELD_NAME}}();";
        code_ +=
            "    return _f ? ::flatbuffers::GetRoot<{{CPP_NAME}}>(_f->Data())";
        code_ += "              : nullptr;";
        code_ += "  }";
      }

      if (field->flexbuffer) {
        code_ +=
            "  flexbuffers::Reference {{FIELD_NAME}}_flexbuffer_root()"
            " const {";
        // Both Data() and size() are const-methods, therefore call order
        // doesn't matter.
        code_ += "    const auto _f = {{FIELD_NAME}}();";
        code_ += "    return _f ? flexbuffers::GetRoot(_f->Data(), _f->size())";
        code_ += "              : flexbuffers::Reference();";
        code_ += "  }";
      }

      // Generate a comparison function for this field if it is a key.
      if (field->key) { GenKeyFieldMethods(*field); }
    }

    if (opts_.cpp_static_reflection) { GenIndexBasedFieldGetter(struct_def); }

    // Generate a verifier function that can check a buffer from an untrusted
    // source will never cause reads outside the buffer.
    code_ += "  bool Verify(::flatbuffers::Verifier &verifier) const {";
    code_ += "    return VerifyTableStart(verifier)\\";
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) { continue; }
      GenVerifyCall(*field, " &&\n           ");
    }

    code_ += " &&\n           verifier.EndTable();";
    code_ += "  }";

    if (opts_.generate_object_based_api) {
      // Generate the UnPack() pre declaration.
      code_ += "  " + TableUnPackSignature(struct_def, true, opts_) + ";";
      code_ += "  " + TableUnPackToSignature(struct_def, true, opts_) + ";";
      code_ += "  " + TablePackSignature(struct_def, true, opts_) + ";";
    }

    code_ += "};";  // End of table.
    code_ += "";

    // Explicit specializations for union accessors
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated || field->value.type.base_type != BASE_TYPE_UNION) {
        continue;
      }

      auto u = field->value.type.enum_def;
      if (u->uses_multiple_type_instances) continue;

      code_.SetValue("FIELD_NAME", Name(*field));

      for (auto u_it = u->Vals().begin(); u_it != u->Vals().end(); ++u_it) {
        auto &ev = **u_it;
        if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }

        auto full_struct_name = GetUnionElement(ev, false, opts_);

        code_.SetValue(
            "U_ELEMENT_TYPE",
            WrapInNameSpace(u->defined_namespace, GetEnumValUse(*u, ev)));
        code_.SetValue("U_FIELD_TYPE", "const " + full_struct_name + " *");
        code_.SetValue("U_ELEMENT_NAME", full_struct_name);
        code_.SetValue("U_FIELD_NAME", Name(*field) + "_as_" + Name(ev));

        // `template<> const T *union_name_as<T>() const` accessor.
        code_ +=
            "template<> "
            "inline {{U_FIELD_TYPE}}{{STRUCT_NAME}}::{{FIELD_NAME}}_as"
            "<{{U_ELEMENT_NAME}}>() const {";
        code_ += "  return {{U_FIELD_NAME}}();";
        code_ += "}";
        code_ += "";
      }
    }

    GenBuilders(struct_def);

    if (opts_.generate_object_based_api) {
      // Generate a pre-declaration for a CreateX method that works with an
      // unpacked C++ object.
      code_ += TableCreateSignature(struct_def, true, opts_) + ";";
      code_ += "";
    }
  }